

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

bool treatAsAbsolute(QString *path)

{
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QFileInfo local_60;
  QFileSystemEntry local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.m_filePath.d.d = (Data *)(path->d).ptr;
  local_58.m_filePath.d.ptr = (char16_t *)(path->d).size;
  qVar3 = QStringView::indexOf((QStringView *)&local_58,(QChar)0x3a,0,CaseSensitive);
  bVar4 = qVar3 != -1;
  if (bVar4) {
    QFileInfo::QFileInfo(&local_60,path);
    bVar1 = QFileInfo::isRelative(&local_60);
    if (!bVar1) {
      bVar4 = true;
      bVar1 = false;
      bVar2 = true;
      goto LAB_00145c76;
    }
  }
  QFileSystemEntry::QFileSystemEntry(&local_58,path);
  bVar2 = QFileSystemEntry::isAbsolute(&local_58);
  bVar1 = true;
LAB_00145c76:
  if (bVar1) {
    if (&(local_58.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_58.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate(&(local_58.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_58.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_58.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (bVar4) {
    QFileInfo::~QFileInfo(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool treatAsAbsolute(const QString &path)
{
    // ### Qt 6: be consistent about absolute paths

    // QFileInfo will use the right FS-engine for virtual file-systems
    // (e.g. resource paths).  Unfortunately, for real file-systems, it relies
    // on QFileSystemEntry's isRelative(), which is flawed on MS-Win, ignoring
    // its (correct) isAbsolute().  So only use that isAbsolute() unless there's
    // a colon in the path.
    // FIXME: relies on virtual file-systems having colons in their prefixes.
    // The case of an MS-absolute C:/... path happens to work either way.
    return (path.contains(u':') && QFileInfo(path).isAbsolute())
        || QFileSystemEntry(path).isAbsolute();
}